

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O0

_Bool got_savefile(savefile_getter *pg)

{
  _Bool _Var1;
  savefile_getter psVar2;
  ang_dir *paVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  _Bool no_entry;
  char *desc;
  char path [1024];
  char fname [256];
  savefile_getter *pg_local;
  
  if (*pg == (savefile_getter)0x0) {
    psVar2 = (savefile_getter)mem_zalloc(0x28);
    *pg = psVar2;
    safe_setuid_grab();
    paVar3 = my_dopen(ANGBAND_DIR_SAVE);
    (*pg)->d = paVar3;
    safe_setuid_drop();
    if ((*pg)->d == (ang_dir *)0x0) {
      return false;
    }
    (*pg)->have_savedir = true;
    ((*pg)->details).foff = 0;
  }
  else if ((*pg)->d == (ang_dir *)0x0) {
    if (((*pg)->have_details & 1U) == 0) {
      return false;
    }
    __assert_fail("!(*pg)->have_details",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-game.c"
                  ,0x4a7,"_Bool got_savefile(savefile_getter *)");
  }
  safe_setuid_grab();
  _Var1 = my_dread((*pg)->d,path + 0x3f8,0x100);
  safe_setuid_drop();
  bVar6 = ((_Var1 ^ 0xffU) & 1) == 0;
  if (bVar6) {
    path_build((char *)&desc,0x400,ANGBAND_DIR_SAVE,path + 0x3f8);
    pcVar4 = savefile_get_description((char *)&desc);
    string_free(((*pg)->details).fnam);
    pcVar5 = string_make(path + 0x3f8);
    ((*pg)->details).fnam = pcVar5;
    string_free(((*pg)->details).desc);
    pcVar4 = string_make(pcVar4);
    ((*pg)->details).desc = pcVar4;
    (*pg)->have_details = true;
  }
  else {
    my_dclose((*pg)->d);
    (*pg)->d = (ang_dir *)0x0;
    (*pg)->have_details = false;
  }
  return bVar6;
}

Assistant:

bool got_savefile(savefile_getter *pg)
{
	char fname[256];

	if (*pg == NULL) {
		/* Initialize the enumeration. */
		*pg = mem_zalloc(sizeof(**pg));
		/* Need enhanced privileges to read from the save directory. */
		safe_setuid_grab();
		(*pg)->d = my_dopen(ANGBAND_DIR_SAVE);
		safe_setuid_drop();
		if (!(*pg)->d) {
			return false;
		}
		(*pg)->have_savedir = true;
		/*
		 * Set up the user-specific prefix.  Mimics savefile_set_name().
		 */
#ifdef SETGID
		strnfmt((*pg)->uid_c, sizeof((*pg)->uid_c), "%d.", player_uid);
		(*pg)->details.foff = strlen((*pg)->uid_c);
#else
		(*pg)->details.foff = 0;
#endif
	} else {
		if (!(*pg)->d) {
			assert(!(*pg)->have_details);
			return false;
		}
	}

	while (1) {
		char path[1024];
		const char *desc;
		bool no_entry;

		/*
		 * Also need elevated privileges for the file attribute queries
		 * in my_dread().
		 */
		safe_setuid_grab();
		no_entry = !my_dread((*pg)->d, fname, sizeof(fname));
		safe_setuid_drop();
		if (no_entry) {
			break;
		}

#ifdef SETGID
		/* Check that the savefile name begins with the user's ID. */
		if (!prefix(fname, (*pg)->uid_c)) {
			continue;
		}
#endif

		path_build(path, sizeof(path), ANGBAND_DIR_SAVE, fname);
		desc = savefile_get_description(path);
		string_free((*pg)->details.fnam);
		(*pg)->details.fnam = string_make(fname);
		string_free((*pg)->details.desc);
		(*pg)->details.desc = string_make(desc);
		(*pg)->have_details = true;
		return true;
	}

	my_dclose((*pg)->d);
	(*pg)->d = NULL;
	(*pg)->have_details = false;

	return false;
}